

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O2

int testUTF8(int param_1,char **param_2)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  ulong in_RAX;
  char *pcVar5;
  size_t sVar6;
  int iVar7;
  uint *puVar8;
  ulong uVar9;
  test_utf8_char *c;
  test_utf8_char *ptVar10;
  uint uVar11;
  char **s;
  char **ppcVar12;
  test_utf8_char c_00;
  test_utf8_char c_01;
  test_utf8_char c_02;
  test_utf8_char c_03;
  test_utf8_char c_04;
  test_utf8_char c_05;
  test_utf8_char s_00;
  test_utf8_char s_01;
  test_utf8_char s_02;
  test_utf8_char s_03;
  undefined8 local_38;
  
  puVar8 = &good_entry[0].chr;
  iVar7 = 0;
  local_38 = in_RAX;
  do {
    uVar1 = (((test_utf8_entry *)(puVar8 + -4))->str)._M_len;
    if (uVar1 == 0) {
      for (ptVar10 = bad_chars; sVar3 = ptVar10->_M_len, sVar3 != 0; ptVar10 = ptVar10 + 1) {
        pcVar2 = ptVar10->_M_str;
        local_38 = CONCAT44(0xffff,(uint)local_38);
        pcVar5 = cm_utf8_decode_character(pcVar2,pcVar2 + sVar3,(uint *)((long)&local_38 + 4));
        if (pcVar5 == (char *)0x0) {
          c_05._M_str = pcVar2;
          c_05._M_len = sVar3;
          report_bad(true,c_05);
          puts("failed as expected");
        }
        else {
          c_04._M_str = pcVar2;
          c_04._M_len = sVar3;
          report_bad(false,c_04);
          printf("expected failure, got 0x%04X\n",local_38 >> 0x20);
          iVar7 = 1;
        }
        s_01._M_str = pcVar2;
        s_01._M_len = sVar3;
        bVar4 = is_invalid(s_01);
        if (!bVar4) {
          iVar7 = 1;
        }
      }
      for (ppcVar12 = good_strings; pcVar2 = *ppcVar12, pcVar2 != (char *)0x0;
          ppcVar12 = ppcVar12 + 1) {
        sVar6 = strlen(pcVar2);
        s_02._M_str = pcVar2;
        s_02._M_len = sVar6;
        bVar4 = is_valid(s_02);
        if (!bVar4) {
          iVar7 = 1;
        }
      }
      for (ppcVar12 = bad_strings; pcVar2 = *ppcVar12, pcVar2 != (char *)0x0;
          ppcVar12 = ppcVar12 + 1) {
        sVar6 = strlen(pcVar2);
        s_03._M_str = pcVar2;
        s_03._M_len = sVar6;
        bVar4 = is_invalid(s_03);
        if (!bVar4) {
          iVar7 = 1;
        }
      }
      return iVar7;
    }
    pcVar2 = *(char **)(puVar8 + -2);
    pcVar5 = cm_utf8_decode_character(pcVar2,pcVar2 + uVar1,(uint *)&local_38);
    if (pcVar5 == (char *)0x0) {
      c_01._M_str = pcVar2;
      c_01._M_len = uVar1;
      report_good(false,c_01);
      puts("failed");
LAB_001b90db:
      iVar7 = 1;
    }
    else {
      uVar11 = *puVar8;
      if ((uint)local_38 != uVar11) {
        c_02._M_str = pcVar2;
        c_02._M_len = uVar1;
        report_good(false,c_02);
        pcVar5 = "expected 0x%04X, got 0x%04X\n";
        uVar9 = (ulong)uVar11;
        uVar11 = (uint)local_38;
LAB_001b90d0:
        printf(pcVar5,uVar9,(ulong)uVar11);
        goto LAB_001b90db;
      }
      uVar11 = (int)pcVar5 - (int)pcVar2;
      if (uVar11 != (uint)uVar1) {
        c_03._M_str = pcVar2;
        c_03._M_len = uVar1;
        report_good(false,c_03);
        pcVar5 = "had %d bytes, used %d\n";
        uVar9 = uVar1 & 0xffffffff;
        goto LAB_001b90d0;
      }
      c_00._M_str = pcVar2;
      c_00._M_len = uVar1;
      report_good(true,c_00);
      printf("got 0x%04X\n",local_38 & 0xffffffff);
    }
    s_00._M_str = pcVar2;
    s_00._M_len = uVar1;
    bVar4 = is_valid(s_00);
    if (!bVar4) {
      iVar7 = 1;
    }
    puVar8 = puVar8 + 6;
  } while( true );
}

Assistant:

int testUTF8(int /*unused*/, char* /*unused*/[])
{
  int result = 0;
  for (test_utf8_entry const* e = good_entry; !e->str.empty(); ++e) {
    if (!decode_good(*e)) {
      result = 1;
    }
    if (!is_valid(e->str)) {
      result = 1;
    }
  }
  for (test_utf8_char* c = bad_chars; !(*c).empty(); ++c) {
    if (!decode_bad(*c)) {
      result = 1;
    }
    if (!is_invalid(*c)) {
      result = 1;
    }
  }
  for (char const** s = good_strings; *s; ++s) {
    if (!is_valid(*s)) {
      result = 1;
    }
  }
  for (char const** s = bad_strings; *s; ++s) {
    if (!is_invalid(*s)) {
      result = 1;
    }
  }
  return result;
}